

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InferenceStore.cpp
# Opt level: O0

string * __thiscall
Kernel::InferenceStore::TPTPProofPrinter::
getNewSymbols<Lib::Stack<std::pair<Kernel::SymbolType,unsigned_int>>::ConstIterator>
          (TPTPProofPrinter *this,string *origin,ConstIterator symIt)

{
  bool bVar1;
  pair<Kernel::SymbolType,_unsigned_int> pVar2;
  string *psVar3;
  Signature *in_RDX;
  string *in_RDI;
  SymbolId sym;
  ostringstream symsStr;
  undefined4 in_stack_fffffffffffffdb8;
  int in_stack_fffffffffffffdbc;
  undefined7 in_stack_fffffffffffffdc0;
  undefined1 in_stack_fffffffffffffdc7;
  int in_stack_fffffffffffffde4;
  string local_1f8 [32];
  string local_1d8 [32];
  undefined4 in_stack_fffffffffffffe48;
  SymbolType in_stack_fffffffffffffe4c;
  uint in_stack_fffffffffffffe50;
  undefined4 in_stack_fffffffffffffe54;
  TPTPProofPrinter *in_stack_fffffffffffffe58;
  ostringstream local_1a0 [392];
  ConstRefIterator local_18;
  
  std::__cxx11::ostringstream::ostringstream(local_1a0);
  while( true ) {
    bVar1 = Lib::Stack<std::pair<Kernel::SymbolType,_unsigned_int>_>::ConstRefIterator::hasNext
                      (&local_18);
    in_stack_fffffffffffffde4 = CONCAT13(bVar1,(int3)in_stack_fffffffffffffde4);
    if (!bVar1) break;
    pVar2 = Lib::Stack<std::pair<Kernel::SymbolType,_unsigned_int>_>::ConstIterator::next
                      ((ConstIterator *)
                       CONCAT44(in_stack_fffffffffffffdbc,in_stack_fffffffffffffdb8));
    in_stack_fffffffffffffe4c = pVar2.first;
    in_stack_fffffffffffffe50 = pVar2.second;
    if (in_stack_fffffffffffffe4c == FUNC) {
      psVar3 = Signature::functionName_abi_cxx11_(in_RDX,in_stack_fffffffffffffde4);
      std::operator<<((ostream *)local_1a0,(string *)psVar3);
    }
    else if (in_stack_fffffffffffffe4c == PRED) {
      psVar3 = Signature::predicateName_abi_cxx11_
                         ((Signature *)CONCAT17(in_stack_fffffffffffffdc7,in_stack_fffffffffffffdc0)
                          ,in_stack_fffffffffffffdbc);
      std::operator<<((ostream *)local_1a0,(string *)psVar3);
    }
    else {
      psVar3 = Signature::typeConName_abi_cxx11_
                         ((Signature *)CONCAT17(in_stack_fffffffffffffdc7,in_stack_fffffffffffffdc0)
                          ,in_stack_fffffffffffffdbc);
      std::operator<<((ostream *)local_1a0,(string *)psVar3);
    }
    in_stack_fffffffffffffdc7 =
         Lib::Stack<std::pair<Kernel::SymbolType,_unsigned_int>_>::ConstRefIterator::hasNext
                   (&local_18);
    if ((bool)in_stack_fffffffffffffdc7) {
      std::operator<<((ostream *)local_1a0,',');
    }
  }
  std::__cxx11::string::string(local_1d8,(string *)in_RDX);
  std::__cxx11::ostringstream::str();
  getNewSymbols(in_stack_fffffffffffffe58,
                (string *)CONCAT44(in_stack_fffffffffffffe54,in_stack_fffffffffffffe50),
                (string *)CONCAT44(in_stack_fffffffffffffe4c,in_stack_fffffffffffffe48));
  std::__cxx11::string::~string(local_1f8);
  std::__cxx11::string::~string(local_1d8);
  std::__cxx11::ostringstream::~ostringstream(local_1a0);
  return in_RDI;
}

Assistant:

std::string getNewSymbols(std::string origin, It symIt) {
    std::ostringstream symsStr;
    while(symIt.hasNext()) {
      SymbolId sym = symIt.next();
      if (sym.first == SymbolType::FUNC ) {
        symsStr << env.signature->functionName(sym.second);
      } else if (sym.first == SymbolType::PRED){
        symsStr << env.signature->predicateName(sym.second);
      } else {
        symsStr << env.signature->typeConName(sym.second);
      }
      if (symIt.hasNext()) {
        symsStr << ',';
      }
    }
    return getNewSymbols(origin, symsStr.str());
  }